

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O3

int __thiscall branch_and_reduce_algorithm::get_max_deg_vtx(branch_and_reduce_algorithm *this)

{
  int iVar1;
  pointer piVar2;
  pointer pvVar3;
  int *piVar4;
  pointer piVar5;
  int iVar6;
  iterator __begin3;
  long lVar7;
  int *piVar8;
  ulong uVar9;
  int iVar10;
  int *piVar11;
  int u;
  long lVar12;
  int iVar13;
  int local_3c;
  long local_38;
  
  iVar13 = -1;
  lVar12 = 0;
  local_38 = 0;
  do {
    if ((this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar12] < 0) {
      iVar6 = deg(this,(int)lVar12);
      if (iVar13 <= iVar6) {
        iVar1 = (this->used).uid;
        iVar10 = iVar1 + 1;
        (this->used).uid = iVar10;
        if (iVar1 < -1) {
          piVar2 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar7 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar2;
          if (lVar7 != 0) {
            uVar9 = 0;
            do {
              piVar2[uVar9] = 0;
              uVar9 = uVar9 + 1;
            } while ((uVar9 & 0xffffffff) < (ulong)(lVar7 >> 2));
          }
          (this->used).uid = 1;
          iVar10 = 1;
        }
        pvVar3 = (this->adj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar8 = pvVar3[lVar12].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = *(pointer *)
                  ((long)&pvVar3[lVar12].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data + 8);
        if (piVar8 == piVar4) {
LAB_001199e4:
          lVar7 = 0;
        }
        else {
          piVar2 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar5 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar11 = piVar8;
          do {
            if (piVar2[*piVar11] < 0) {
              piVar5[*piVar11] = iVar10;
            }
            piVar11 = piVar11 + 1;
          } while (piVar11 != piVar4);
          if (piVar8 == piVar4) goto LAB_001199e4;
          piVar2 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar7 = 0;
          do {
            iVar10 = *piVar8;
            if (piVar2[iVar10] < 0) {
              for (piVar11 = pvVar3[iVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
                  piVar11 !=
                  *(pointer *)
                   ((long)&pvVar3[iVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data + 8); piVar11 = piVar11 + 1) {
                if (piVar2[*piVar11] < 0) {
                  lVar7 = lVar7 + (ulong)((this->used).used.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start[*piVar11] ==
                                         (this->used).uid);
                }
              }
            }
            piVar8 = piVar8 + 1;
          } while (piVar8 != piVar4);
        }
        if ((iVar13 < iVar6) || ((iVar13 == iVar6 && (lVar7 < local_38)))) {
          iVar13 = iVar6;
          local_3c = (int)lVar12;
          local_38 = lVar7;
        }
      }
    }
    lVar12 = lVar12 + 1;
    if (this->n <= lVar12) {
      return local_3c;
    }
  } while( true );
}

Assistant:

int inline branch_and_reduce_algorithm::get_max_deg_vtx()
{
    int v, dv = -1;
    long long minE = 0;
    for (int u = 0; u < n; u++)
        if (x[u] < 0)
        {
            int degree = deg(u);
            if (dv > degree)
                continue;
            long long e = 0;
            used.clear();
            for (int w : adj[u])
                if (x[w] < 0)
                    used.add(w);
            for (int w : adj[u])
                if (x[w] < 0)
                {
                    for (int w2 : adj[w])
                        if (x[w2] < 0 && used.get(w2))
                            e++;
                }
            if (dv < degree || (dv == degree && minE > e))
            {
                dv = degree;
                minE = e;
                v = u;
            }
        }

    return v;
}